

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O1

void Ssw_ManLabelPiNodes(Ssw_Man_t *p)

{
  undefined1 *puVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  Aig_Man_t *pAVar5;
  
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10;
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  if (0 < p->nFrames) {
    iVar3 = 0;
    do {
      pAVar5 = p->pAig;
      if (0 < pAVar5->nTruePis) {
        lVar4 = 0;
        do {
          if (pAVar5->vCis->nSize <= lVar4) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar2 = *(ulong *)&p->pNodeToFrames
                             [*(int *)((long)pAVar5->vCis->pArray[lVar4] + 0x24) * p->nFrames +
                              iVar3]->field_0x18;
          if (((uint)uVar2 & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjFrames)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0x39,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
          }
          if ((uVar2 & 0x20) != 0) {
            __assert_fail("pObjFrames->fMarkB == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0x3a,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
          }
          *(ulong *)&p->pNodeToFrames
                     [*(int *)((long)pAVar5->vCis->pArray[lVar4] + 0x24) * p->nFrames + iVar3]->
                     field_0x18 = uVar2 | 0x30;
          lVar4 = lVar4 + 1;
          pAVar5 = p->pAig;
        } while (lVar4 < pAVar5->nTruePis);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < p->nFrames);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Label PIs nodes of the frames corresponding to PIs of AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManLabelPiNodes( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFrames;
    int f, i;
    Aig_ManConst1( p->pFrames )->fMarkA = 1;
    Aig_ManConst1( p->pFrames )->fMarkB = 1;
    for ( f = 0; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrames = Ssw_ObjFrame( p, pObj, f );
            assert( Aig_ObjIsCi(pObjFrames) );
            assert( pObjFrames->fMarkB == 0 );
            pObjFrames->fMarkA = 1;
            pObjFrames->fMarkB = 1;
        }
    }
}